

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_map.h
# Opt level: O0

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::OneofDescriptor_*,_google::protobuf::compiler::java::OneofGeneratorInfo>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::OneofDescriptor_*const,_google::protobuf::compiler::java::OneofGeneratorInfo>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
::try_emplace_impl<google::protobuf::OneofDescriptor_const*const&>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::OneofDescriptor_*,_google::protobuf::compiler::java::OneofGeneratorInfo>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::OneofDescriptor_*const,_google::protobuf::compiler::java::OneofGeneratorInfo>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
          *this,OneofDescriptor **k)

{
  iterator iter;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::OneofDescriptor_*,_google::protobuf::compiler::java::OneofGeneratorInfo>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::OneofDescriptor_*const,_google::protobuf::compiler::java::OneofGeneratorInfo>_>_>::iterator,_bool>
  *res;
  tuple<const_google::protobuf::OneofDescriptor_*const_&> local_30;
  ctrl_t *local_28;
  anon_union_8_1_a8a14541_for_iterator_2 local_20;
  OneofDescriptor **local_18;
  OneofDescriptor **k_local;
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::OneofDescriptor_*,_google::protobuf::compiler::java::OneofGeneratorInfo>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::OneofDescriptor_*const,_google::protobuf::compiler::java::OneofGeneratorInfo>_>_>
  *this_local;
  
  local_18 = k;
  k_local = (OneofDescriptor **)this;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
  ::find_or_prepare_insert<google::protobuf::OneofDescriptor_const*>
            (__return_storage_ptr__,
             (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
              *)this,k);
  if ((__return_storage_ptr__->second & 1U) != 0) {
    local_28 = (__return_storage_ptr__->first).ctrl_;
    local_20 = (anon_union_8_1_a8a14541_for_iterator_2)(__return_storage_ptr__->first).field_1.slot_
    ;
    std::forward_as_tuple<google::protobuf::OneofDescriptor_const*const&>
              ((OneofDescriptor **)&local_30);
    std::forward_as_tuple<>();
    iter.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)
                   (anon_union_8_1_a8a14541_for_iterator_2)local_20.slot_;
    iter.ctrl_ = local_28;
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
    ::
    emplace_at<std::piecewise_construct_t_const&,std::tuple<google::protobuf::OneofDescriptor_const*const&>,std::tuple<>>
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
                *)this,iter,(piecewise_construct_t *)&std::piecewise_construct,&local_30,
               (tuple<> *)((long)&res + 7));
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    auto res = this->find_or_prepare_insert(k);
    if (res.second) {
      this->emplace_at(res.first, std::piecewise_construct,
                       std::forward_as_tuple(std::forward<K>(k)),
                       std::forward_as_tuple(std::forward<Args>(args)...));
    }
    return res;
  }